

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

ZSTD_DDict *
ZSTD_initStaticDDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType)

{
  uint uVar1;
  size_t code;
  size_t in_RCX;
  ZSTD_DDict *in_RDX;
  ulong in_RSI;
  ZSTD_DDict *in_RDI;
  int in_R8D;
  ZSTD_DDict *ddict;
  size_t neededSpace;
  size_t local_48;
  ZSTD_DDict *dict_00;
  ZSTD_DDict *in_stack_fffffffffffffff8;
  
  local_48 = in_RCX;
  if (in_R8D == 1) {
    local_48 = 0;
  }
  if (((ulong)in_RDI & 7) == 0) {
    if (in_RSI < local_48 + 0x7060) {
      in_RDI = (ZSTD_DDict *)0x0;
    }
    else {
      dict_00 = in_RDI;
      if (in_R8D == 0) {
        memcpy(in_RDI + 1,in_RDX,in_RCX);
        in_RDX = in_RDI + 1;
      }
      code = ZSTD_initDDict_internal
                       (in_stack_fffffffffffffff8,dict_00,in_RSI,
                        (ZSTD_dictLoadMethod_e)((ulong)in_RDX >> 0x20),
                        (ZSTD_dictContentType_e)in_RDX);
      uVar1 = ERR_isError(code);
      if (uVar1 != 0) {
        in_RDI = (ZSTD_DDict *)0x0;
      }
    }
  }
  else {
    in_RDI = (ZSTD_DDict *)0x0;
  }
  return in_RDI;
}

Assistant:

const ZSTD_DDict* ZSTD_initStaticDDict(
                                void* workspace, size_t workspaceSize,
                                const void* dict, size_t dictSize,
                                ZSTD_dictLoadMethod_e dictLoadMethod,
                                ZSTD_dictContentType_e dictContentType)
{
    size_t const neededSpace =
            sizeof(ZSTD_DDict) + (dictLoadMethod == ZSTD_dlm_byRef ? 0 : dictSize);
    ZSTD_DDict* const ddict = (ZSTD_DDict*)workspace;
    assert(workspace != NULL);
    assert(dict != NULL);
    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */
    if (workspaceSize < neededSpace) return NULL;
    if (dictLoadMethod == ZSTD_dlm_byCopy) {
        memcpy(ddict+1, dict, dictSize);  /* local copy */
        dict = ddict+1;
    }
    if (ZSTD_isError( ZSTD_initDDict_internal(ddict, dict, dictSize, ZSTD_dlm_byRef, dictContentType) ))
        return NULL;
    return ddict;
}